

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

StringRef getArchSynonym(StringRef Arch)

{
  long lVar1;
  long *plVar2;
  char *pcVar3;
  StringRef SVar4;
  StringRef SVar5;
  StringRef SVar6;
  StringRef SVar7;
  StringRef SVar8;
  StringRef SVar9;
  StringRef SVar10;
  StringRef SVar11;
  StringRef SVar12;
  
  plVar2 = (long *)Arch.Data;
  switch(Arch.Length) {
  case 2:
    if ((short)*plVar2 == 0x3576) {
      SVar8.Length = 3;
      SVar8.Data = "v5t";
      return SVar8;
    }
    if ((short)*plVar2 == 0x3776) {
LAB_001af0e7:
      pcVar3 = "v7-a";
      goto LAB_001af112;
    }
    if ((short)*plVar2 != 0x3876) {
      return Arch;
    }
    break;
  case 3:
    if (*(char *)((long)plVar2 + 2) == 'e' && (short)*plVar2 == 0x3576) {
      pcVar3 = "v5te";
      goto LAB_001af112;
    }
    if (*(char *)((long)plVar2 + 2) == 'j' && (short)*plVar2 == 0x3676) {
      SVar10.Length = 2;
      SVar10.Data = "v6";
      return SVar10;
    }
    if (*(char *)((long)plVar2 + 2) != 'm' || (short)*plVar2 != 0x3676) {
      if (*(char *)((long)plVar2 + 2) != 'z' || (short)*plVar2 != 0x3676) {
        pcVar3 = "v7-a";
        if ((*(char *)((long)plVar2 + 2) != 'a' || (short)*plVar2 != 0x3776) &&
           (*(char *)((long)plVar2 + 2) != 'l' || (short)*plVar2 != 0x3776)) {
          if (*(char *)((long)plVar2 + 2) == 'r' && (short)*plVar2 == 0x3776) {
            pcVar3 = "v7-r";
          }
          else if (*(char *)((long)plVar2 + 2) == 'm' && (short)*plVar2 == 0x3776) {
            pcVar3 = "v7-m";
          }
          else {
            pcVar3 = "v8-a";
            if ((*(char *)((long)plVar2 + 2) != 'a' || (short)*plVar2 != 0x3876) &&
               (*(char *)((long)plVar2 + 2) != 'l' || (short)*plVar2 != 0x3876)) {
              if (*(char *)((long)plVar2 + 2) != 'r' || (short)*plVar2 != 0x3876) {
                return Arch;
              }
              pcVar3 = "v8-r";
            }
          }
        }
        goto LAB_001af112;
      }
LAB_001af0f0:
      pcVar3 = "v6kz";
      goto LAB_001af112;
    }
    goto LAB_001af098;
  case 4:
    if ((int)*plVar2 == 0x6c683676) {
      SVar6.Length = 3;
      SVar6.Data = "v6k";
      return SVar6;
    }
    if ((int)*plVar2 != 0x6d733676) {
      if ((int)*plVar2 == 0x6b7a3676) goto LAB_001af0f0;
      if ((int)*plVar2 != 0x6c683776) {
        if ((int)*plVar2 != 0x6d653776) {
          return Arch;
        }
        SVar4.Length = 5;
        SVar4.Data = "v7e-m";
        return SVar4;
      }
      goto LAB_001af0e7;
    }
LAB_001af098:
    pcVar3 = "v6-m";
    goto LAB_001af112;
  case 5:
    if (*(char *)((long)plVar2 + 4) == 'm' && (int)*plVar2 == 0x2d733676) goto LAB_001af098;
    if (*(char *)((long)plVar2 + 4) != '4' || (int)*plVar2 != 0x366d7261) {
      if (*(char *)((long)plVar2 + 4) == 'a' && (int)*plVar2 == 0x312e3876) {
        pcVar3 = "v8.1-a";
      }
      else if (*(char *)((long)plVar2 + 4) == 'a' && (int)*plVar2 == 0x322e3876) {
        pcVar3 = "v8.2-a";
      }
      else if (*(char *)((long)plVar2 + 4) == 'a' && (int)*plVar2 == 0x332e3876) {
        pcVar3 = "v8.3-a";
      }
      else {
        if (*(char *)((long)plVar2 + 4) != 'a' || (int)*plVar2 != 0x342e3876) {
          return Arch;
        }
        pcVar3 = "v8.4-a";
      }
      SVar12.Length = 6;
      SVar12.Data = pcVar3;
      return SVar12;
    }
    break;
  default:
    return Arch;
  case 7:
    if (*(int *)((long)plVar2 + 3) != 0x34366863 || (int)*plVar2 != 0x63726161) {
      return Arch;
    }
    SVar9.Length = 4;
    SVar9.Data = "v8-a";
    return SVar9;
  case 8:
    if (*plVar2 == 0x657361622e6d3876) {
      SVar7.Length = 9;
      SVar7.Data = "v8-m.base";
      return SVar7;
    }
    lVar1 = *plVar2;
    if (lVar1 == 0x6e69616d2e6d3876) {
      plVar2 = (long *)0x1da8a3;
    }
    SVar5.Length = (ulong)(lVar1 == 0x6e69616d2e6d3876) | 8;
    SVar5.Data = (char *)plVar2;
    return SVar5;
  }
  pcVar3 = "v8-a";
LAB_001af112:
  SVar11.Length = 4;
  SVar11.Data = pcVar3;
  return SVar11;
}

Assistant:

static StringRef getArchSynonym(StringRef Arch) {
  return StringSwitch<StringRef>(Arch)
      .Case("v5", "v5t")
      .Case("v5e", "v5te")
      .Case("v6j", "v6")
      .Case("v6hl", "v6k")
      .Cases("v6m", "v6sm", "v6s-m", "v6-m")
      .Cases("v6z", "v6zk", "v6kz")
      .Cases("v7", "v7a", "v7hl", "v7l", "v7-a")
      .Case("v7r", "v7-r")
      .Case("v7m", "v7-m")
      .Case("v7em", "v7e-m")
      .Cases("v8", "v8a", "v8l", "aarch64", "arm64", "v8-a")
      .Case("v8.1a", "v8.1-a")
      .Case("v8.2a", "v8.2-a")
      .Case("v8.3a", "v8.3-a")
      .Case("v8.4a", "v8.4-a")
      .Case("v8r", "v8-r")
      .Case("v8m.base", "v8-m.base")
      .Case("v8m.main", "v8-m.main")
      .Default(Arch);
}